

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

void __thiscall Type::Prepare(Type *this,Env *env,int flags)

{
  bool bVar1;
  int iVar2;
  ID *pIVar3;
  char *pcVar4;
  Expr *pEVar5;
  void *pvVar6;
  LetField *pLVar7;
  Type *pTVar8;
  Field *pFVar9;
  Type *pTVar10;
  undefined4 extraout_var;
  reference ppFVar11;
  Type *in_RCX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  Field *in_RSI;
  string *__fn;
  Field *__fn_00;
  Type *in_RDI;
  void *in_R8;
  Field *f;
  iterator i_1;
  ID *parsing_complete_var;
  ID *has_value_id;
  iterator i;
  Type *in_stack_fffffffffffffe08;
  Type *in_stack_fffffffffffffe10;
  Type *in_stack_fffffffffffffe18;
  Type *in_stack_fffffffffffffe20;
  Type *in_stack_fffffffffffffe40;
  Type *in_stack_fffffffffffffe48;
  ID *in_stack_fffffffffffffe50;
  FILE *__stream;
  ID *in_stack_fffffffffffffe58;
  Env *in_stack_fffffffffffffe60;
  __normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_> local_100;
  string local_f0 [32];
  Type *local_d0;
  undefined1 local_c1;
  string local_c0 [32];
  void *local_a0;
  Field **local_88;
  __normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_> local_80;
  string local_78 [32];
  string local_58 [32];
  string local_38 [40];
  Field *local_10;
  
  in_RDI->env_ = (Env *)in_RSI;
  local_10 = in_RSI;
  pIVar3 = value_var(in_RDI);
  if (pIVar3 == (ID *)0x0) {
    decl_id(in_RDI);
    pcVar4 = ID::Name((ID *)0x14d038);
    strfmt_abi_cxx11_((char *)local_58,"%s",pcVar4);
    __fn = local_58;
    std::__cxx11::string::operator=((string *)&in_RDI->data_id_str_,__fn);
    std::__cxx11::string::~string(local_58);
  }
  else {
    decl_id(in_RDI);
    pcVar4 = ID::Name((ID *)0x14cfba);
    value_var(in_RDI);
    in_RCX = (Type *)ID::Name((ID *)0x14cfd7);
    strfmt_abi_cxx11_((char *)local_38,"%s:%s",pcVar4);
    __fn = local_38;
    std::__cxx11::string::operator=((string *)&in_RDI->data_id_str_,__fn);
    std::__cxx11::string::~string(local_38);
  }
  pIVar3 = value_var(in_RDI);
  if (pIVar3 != (ID *)0x0) {
    value_var(in_RDI);
    in_RCX = in_RDI;
    Env::AddID(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (IDType)((ulong)in_stack_fffffffffffffe50 >> 0x20),in_stack_fffffffffffffe48);
    value_var(in_RDI);
    pcVar4 = Env::LValue((Env *)in_stack_fffffffffffffe10,(ID *)in_stack_fffffffffffffe08);
    strfmt_abi_cxx11_((char *)local_78,"%s",pcVar4);
    __fn = local_78;
    std::__cxx11::string::operator=((string *)&in_RDI->lvalue_,__fn);
    std::__cxx11::string::~string(local_78);
  }
  iVar2 = (int)in_RCX;
  if (in_RDI->attr_letfields_ != (FieldList *)0x0) {
    local_80._M_current =
         (Field **)
         std::vector<Field_*,_std::allocator<Field_*>_>::begin
                   ((vector<Field_*,_std::allocator<Field_*>_> *)in_stack_fffffffffffffe08);
    while( true ) {
      local_88 = (Field **)
                 std::vector<Field_*,_std::allocator<Field_*>_>::end
                           ((vector<Field_*,_std::allocator<Field_*>_> *)in_stack_fffffffffffffe08);
      __fn = (string *)&local_88;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                          *)in_stack_fffffffffffffe10,
                         (__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                          *)in_stack_fffffffffffffe08);
      iVar2 = (int)in_RCX;
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
      operator*(&local_80);
      AddField(in_stack_fffffffffffffe10,(Field *)in_stack_fffffffffffffe08);
      __gnu_cxx::__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
      operator++(&local_80);
    }
  }
  if ((in_RDI->attr_exportsourcedata_ & 1U) != 0) {
    operator_new(0xa0);
    ID::clone(sourcedata_id,(__fn *)__fn,__child_stack,iVar2,in_R8);
    Clone(in_stack_fffffffffffffe40);
    PubVarField::PubVarField
              ((PubVarField *)in_stack_fffffffffffffe20,(ID *)in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10);
    AddField(in_stack_fffffffffffffe10,(Field *)in_stack_fffffffffffffe08);
  }
  pEVar5 = attr_if_expr(in_RDI);
  if (pEVar5 != (Expr *)0x0) {
    pvVar6 = operator_new(0x78);
    local_c1 = 1;
    value_var(in_RDI);
    pcVar4 = ID::Name((ID *)0x14d2d9);
    strfmt_abi_cxx11_((char *)local_c0,"has_%s",pcVar4);
    ID::ID(in_stack_fffffffffffffe50,(string *)in_stack_fffffffffffffe48);
    local_c1 = 0;
    std::__cxx11::string::~string(local_c0);
    local_a0 = pvVar6;
    pLVar7 = (LetField *)operator_new(0xb0);
    Clone(in_stack_fffffffffffffe40);
    attr_if_expr(in_RDI);
    LetField::LetField((LetField *)in_stack_fffffffffffffe20,(ID *)in_stack_fffffffffffffe18,
                       in_stack_fffffffffffffe10,(Expr *)in_stack_fffffffffffffe08);
    in_RDI->has_value_field_ = pLVar7;
    AddField(in_stack_fffffffffffffe10,(Field *)in_stack_fffffffffffffe08);
  }
  bVar1 = incremental_input(in_RDI);
  if (bVar1) {
    pTVar8 = (Type *)operator_new(0x78);
    pIVar3 = value_var(in_RDI);
    if (pIVar3 == (ID *)0x0) {
      pcVar4 = "val";
    }
    else {
      value_var(in_RDI);
      pcVar4 = ID::Name((ID *)0x14d4c9);
    }
    strfmt_abi_cxx11_((char *)local_f0,"%s_parsing_complete",pcVar4);
    ID::ID(in_stack_fffffffffffffe50,(string *)in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(local_f0);
    local_d0 = pTVar8;
    if ((FLAGS_pac_debug & 1U) != 0) {
      __stream = _stderr;
      pcVar4 = ID::Name((ID *)0x14d569);
      fprintf(__stream,"Adding parsing complete var: %s\n",pcVar4);
    }
    pFVar9 = (Field *)operator_new(0xa0);
    pTVar8 = local_d0;
    Clone(local_d0);
    TempVarField::TempVarField
              ((TempVarField *)in_stack_fffffffffffffe20,(ID *)in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10);
    in_RDI->parsing_complete_var_field_ = pFVar9;
    __fn_00 = local_10;
    (*(in_RDI->parsing_complete_var_field_->super_DataDepElement)._vptr_DataDepElement[4])();
    iVar2 = (int)pFVar9;
    bVar1 = NeedsBufferingStateVar(in_stack_fffffffffffffe18);
    if ((bVar1) &&
       (__fn_00 = (Field *)buffering_state_id,
       pTVar10 = Env::GetDataType((Env *)in_stack_fffffffffffffe18,(ID *)in_stack_fffffffffffffe10),
       pTVar10 == (Type *)0x0)) {
      pFVar9 = (Field *)operator_new(0xa0);
      ID::clone(buffering_state_id,(__fn *)__fn_00,__child_stack_00,iVar2,in_R8);
      in_stack_fffffffffffffe20 = Clone(pTVar8);
      PrivVarField::PrivVarField
                ((PrivVarField *)in_stack_fffffffffffffe20,(ID *)in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      in_RDI->buffering_state_var_field_ = pFVar9;
      __fn_00 = in_RDI->buffering_state_var_field_;
      AddField(in_stack_fffffffffffffe10,(Field *)in_stack_fffffffffffffe08);
    }
    bVar1 = incremental_parsing(in_RDI);
    if ((bVar1) && (in_RDI->tot_ == RECORD)) {
      in_stack_fffffffffffffe10 = (Type *)operator_new(0xa0);
      iVar2 = ID::clone(parsing_state_id,(__fn *)__fn_00,__child_stack_01,iVar2,in_R8);
      pIVar3 = (ID *)CONCAT44(extraout_var,iVar2);
      in_stack_fffffffffffffe08 = Clone(pTVar8);
      PrivVarField::PrivVarField
                ((PrivVarField *)in_stack_fffffffffffffe20,pIVar3,in_stack_fffffffffffffe10);
      in_RDI->parsing_state_var_field_ = (Field *)in_stack_fffffffffffffe10;
      AddField(in_stack_fffffffffffffe10,(Field *)in_stack_fffffffffffffe08);
    }
  }
  if (in_RDI->fields_ != (FieldList *)0x0) {
    local_100._M_current =
         (Field **)
         std::vector<Field_*,_std::allocator<Field_*>_>::begin
                   ((vector<Field_*,_std::allocator<Field_*>_> *)in_stack_fffffffffffffe08);
    while( true ) {
      std::vector<Field_*,_std::allocator<Field_*>_>::end
                ((vector<Field_*,_std::allocator<Field_*>_> *)in_stack_fffffffffffffe08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                          *)in_stack_fffffffffffffe10,
                         (__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                          *)in_stack_fffffffffffffe08);
      if (!bVar1) break;
      ppFVar11 = __gnu_cxx::
                 __normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
                 operator*(&local_100);
      (*((*ppFVar11)->super_DataDepElement)._vptr_DataDepElement[4])(*ppFVar11,local_10);
      __gnu_cxx::__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
      operator++(&local_100);
    }
  }
  return;
}

Assistant:

void Type::Prepare(Env* env, int flags)
	{
	env_ = env;
	ASSERT(env_);

	// The name of the value variable
	if ( value_var() )
		{
		data_id_str_ = strfmt("%s:%s", decl_id()->Name(), value_var()->Name());
		}
	else
		{
		data_id_str_ = strfmt("%s", decl_id()->Name());
		}

	if ( value_var() )
		{
		env_->AddID(value_var(), static_cast<IDType>(value_var_type_), this);
		lvalue_ = strfmt("%s", env_->LValue(value_var()));
		}

	foreach (i, FieldList, attr_letfields_)
		{
		AddField(*i);
		}

	if ( attr_exportsourcedata_ )
		{
		ASSERT(flags & TO_BE_PARSED);
		AddField(new PubVarField(sourcedata_id->clone(), extern_type_const_bytestring->Clone()));
		}

	// An optional field
	if ( attr_if_expr() )
		{
		ASSERT(value_var());
		ID* has_value_id = new ID(strfmt("has_%s", value_var()->Name()));
		has_value_field_ = new LetField(has_value_id, extern_type_bool->Clone(), attr_if_expr());
		AddField(has_value_field_);
		}

	if ( incremental_input() )
		{
		ASSERT(flags & TO_BE_PARSED);
		ID* parsing_complete_var = new ID(
			strfmt("%s_parsing_complete", value_var() ? value_var()->Name() : "val"));
		DEBUG_MSG("Adding parsing complete var: %s\n", parsing_complete_var->Name());
		parsing_complete_var_field_ = new TempVarField(parsing_complete_var,
		                                               extern_type_bool->Clone());
		parsing_complete_var_field_->Prepare(env);

		if ( NeedsBufferingStateVar() && ! env->GetDataType(buffering_state_id) )
			{
			buffering_state_var_field_ = new PrivVarField(buffering_state_id->clone(),
			                                              extern_type_int->Clone());
			AddField(buffering_state_var_field_);
			}

		if ( incremental_parsing() && tot_ == RECORD )
			{
			ASSERT(! parsing_state_var_field_);
			parsing_state_var_field_ = new PrivVarField(parsing_state_id->clone(),
			                                            extern_type_int->Clone());
			AddField(parsing_state_var_field_);
			}
		}

	foreach (i, FieldList, fields_)
		{
		Field* f = *i;
		f->Prepare(env);
		}
	}